

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRImage(EXRImage *exrImage)

{
  int local_20;
  int local_1c;
  int i_1;
  int i;
  EXRImage *exrImage_local;
  
  if (exrImage == (EXRImage *)0x0) {
    exrImage_local._4_4_ = -1;
  }
  else {
    for (local_1c = 0; local_1c < exrImage->num_channels; local_1c = local_1c + 1) {
      if ((exrImage->channel_names != (char **)0x0) &&
         (exrImage->channel_names[local_1c] != (char *)0x0)) {
        free(exrImage->channel_names[local_1c]);
      }
      if ((exrImage->images != (uchar **)0x0) && (exrImage->images[local_1c] != (uchar *)0x0)) {
        free(exrImage->images[local_1c]);
      }
    }
    if (exrImage->channel_names != (char **)0x0) {
      free(exrImage->channel_names);
    }
    if (exrImage->images != (uchar **)0x0) {
      free(exrImage->images);
    }
    if (exrImage->pixel_types != (int *)0x0) {
      free(exrImage->pixel_types);
    }
    if (exrImage->requested_pixel_types != (int *)0x0) {
      free(exrImage->requested_pixel_types);
    }
    for (local_20 = 0; local_20 < exrImage->num_custom_attributes; local_20 = local_20 + 1) {
      if (exrImage->custom_attributes[local_20].name != (char *)0x0) {
        free(exrImage->custom_attributes[local_20].name);
      }
      if (exrImage->custom_attributes[local_20].type != (char *)0x0) {
        free(exrImage->custom_attributes[local_20].type);
      }
      if (exrImage->custom_attributes[local_20].value != (uchar *)0x0) {
        free(exrImage->custom_attributes[local_20].value);
      }
    }
    exrImage_local._4_4_ = 0;
  }
  return exrImage_local._4_4_;
}

Assistant:

int FreeEXRImage(EXRImage *exrImage) {

  if (exrImage == NULL) {
    return -1; // Err
  }

  for (int i = 0; i < exrImage->num_channels; i++) {

    if (exrImage->channel_names && exrImage->channel_names[i]) {
      free((char *)exrImage->channel_names[i]); // remove const
    }

    if (exrImage->images && exrImage->images[i]) {
      free(exrImage->images[i]);
    }
  }

  if (exrImage->channel_names) {
    free(exrImage->channel_names);
  }

  if (exrImage->images) {
    free(exrImage->images);
  }

  if (exrImage->pixel_types) {
    free(exrImage->pixel_types);
  }

  if (exrImage->requested_pixel_types) {
    free(exrImage->requested_pixel_types);
  }

  for (int i = 0; i < exrImage->num_custom_attributes; i++) {
    if (exrImage->custom_attributes[i].name) {
      free(exrImage->custom_attributes[i].name);
    }
    if (exrImage->custom_attributes[i].type) {
      free(exrImage->custom_attributes[i].type);
    }
    if (exrImage->custom_attributes[i].value) {
      free(exrImage->custom_attributes[i].value);
    }
  }

  return 0;
}